

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O0

void __thiscall
Assimp::RemoveRedundantMatsProcess::RemoveRedundantMatsProcess(RemoveRedundantMatsProcess *this)

{
  RemoveRedundantMatsProcess *this_local;
  
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess =
       (_func_int **)&PTR__RemoveRedundantMatsProcess_00dfd538;
  std::__cxx11::string::string((string *)&this->mConfigFixedMaterials);
  return;
}

Assistant:

RemoveRedundantMatsProcess::RemoveRedundantMatsProcess()
: mConfigFixedMaterials() {
    // nothing to do here
}